

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int SplitString(char *str,char **tokens,int maxTokens)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)maxTokens;
  if (maxTokens < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
LAB_001012a1:
      return (int)uVar2;
    }
    pcVar1 = strtok(str," \t\n");
    tokens[uVar3] = pcVar1;
    if (pcVar1 == (char *)0x0) {
      uVar2 = uVar3 & 0xffffffff;
      goto LAB_001012a1;
    }
    uVar3 = uVar3 + 1;
    str = (char *)0x0;
  } while( true );
}

Assistant:

int SplitString(char* str, char* tokens[], const int maxTokens)
{
    int i = 0;
    for(i = 0; i < maxTokens; i++)
    {
        char* token = strtok(str, " \t\n");
        str = NULL;
        tokens[i] = token;
        if(token == NULL)
        {
            break;
        }
    }
    return i;
}